

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdlFbInterfaces.h
# Opt level: O0

void __thiscall
Firebird::
IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
::IDisposableBaseImpl
          (IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
           *this)

{
  int iVar1;
  IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
  *this_local;
  
  Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
  ::Inherit();
  (this->
  super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
  ).
  super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
  ._vptr_IVersionedImpl = (_func_int **)&PTR__IDisposableBaseImpl_00221e60;
  if (IDisposableBaseImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IStatus>>>>
      ::IDisposableBaseImpl(Firebird::DoNotInherit)::vTable == '\0') {
    iVar1 = __cxa_guard_acquire(&IDisposableBaseImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IStatus>>>>
                                 ::IDisposableBaseImpl(Firebird::DoNotInherit)::vTable);
    if (iVar1 != 0) {
      IDisposableBaseImpl::VTableImpl::VTableImpl(&IDisposableBaseImpl::vTable);
      __cxa_guard_release(&IDisposableBaseImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IStatus>>>>
                           ::IDisposableBaseImpl(Firebird::DoNotInherit)::vTable);
    }
  }
  *(VTableImpl **)
   ((long)&(this->
           super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
           ).
           super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
           .
           super_IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
           .super_Inherit<Firebird::IStatus>.super_IStatus.super_IDisposable.super_IVersioned + 8) =
       &IDisposableBaseImpl::vTable;
  return;
}

Assistant:

IDisposableBaseImpl(DoNotInherit = DoNotInherit())
		{
			static struct VTableImpl : Base::VTable
			{
				VTableImpl()
				{
					this->version = Base::VERSION;
					this->dispose = &Name::cloopdisposeDispatcher;
				}
			} vTable;

			this->cloopVTable = &vTable;
		}